

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void SstFFSWriterEndStep(SstStream Stream,size_t Timestep)

{
  void *pvVar1;
  void *pvVar2;
  undefined4 uVar3;
  FFSFormatBlock *pFVar4;
  FFSFormatList Formats;
  undefined8 uVar5;
  char *pcVar6;
  FFSFormatList pFVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  void *pvVar10;
  long lVar11;
  FMStructDescRec *pFVar12;
  byte bVar13;
  undefined8 local_108;
  size_t DataSize;
  _SstData MetaDataRec;
  size_t AttributeSize;
  _SstData local_d0;
  size_t MetaDataSize;
  FMStructDescRec struct_list [4];
  
  bVar13 = 0;
  if (_perfstubs_initialized == 1) {
    if (SstFFSWriterEndStep::timer == (void *)0x0) {
      SstFFSWriterEndStep::timer =
           (void *)ps_timer_create_("Marshaling overhead in SstFFSWriterEndStep");
    }
    ps_timer_start_(SstFFSWriterEndStep::timer);
  }
  CP_verbose(Stream,PerStepVerbose,"Calling SstWriterEndStep\n");
  if (Stream->WriterMarshalData == (void *)0x0) {
    InitMarshalData(Stream);
  }
  pvVar1 = Stream->WriterMarshalData;
  if ((*(long *)((long)pvVar1 + 0x28) == 0) && (*(int *)((long)pvVar1 + 0x18) != 0)) {
    pFVar4 = (FFSFormatBlock *)malloc(0x28);
    puVar8 = &DAT_00129c60;
    pFVar12 = struct_list;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      pFVar12->format_name = (char *)*puVar8;
      puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
      pFVar12 = (FMStructDescRec *)((long)pFVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    struct_list[0].format_name = "MetaData";
    struct_list[0].field_list = *(FMFieldList *)((long)pvVar1 + 0x20);
    struct_list[0].struct_size = FMstruct_size_field_list(struct_list[0].field_list,8);
    uVar5 = register_data_format(*(undefined8 *)((long)pvVar1 + 0x10),struct_list);
    *(undefined8 *)((long)pvVar1 + 0x28) = uVar5;
    pcVar6 = (char *)get_server_rep_FMformat(uVar5,&MetaDataRec);
    pFVar4->FormatServerRep = pcVar6;
    pFVar4->FormatServerRepLen = (long)(int)MetaDataRec.DataSize;
    pcVar6 = (char *)get_server_ID_FMformat(uVar5,&MetaDataRec);
    pFVar4->FormatIDRep = pcVar6;
    pFVar4->FormatIDRepLen = (long)(int)MetaDataRec.DataSize;
    pFVar4->Next = (FFSFormatBlock *)0x0;
  }
  else {
    pFVar4 = (FFSFormatBlock *)0x0;
  }
  Formats = pFVar4;
  if ((*(long *)((long)pvVar1 + 0x40) == 0) && (*(int *)((long)pvVar1 + 0x30) != 0)) {
    Formats = (FFSFormatList)malloc(0x28);
    puVar8 = &DAT_00129c60;
    pFVar12 = struct_list;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      pFVar12->format_name = (char *)*puVar8;
      puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
      pFVar12 = (FMStructDescRec *)((long)pFVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    struct_list[0].format_name = "Data";
    struct_list[0].field_list = *(FMFieldList *)((long)pvVar1 + 0x38);
    struct_list[0].struct_size = FMstruct_size_field_list(struct_list[0].field_list,8);
    uVar5 = register_data_format(*(undefined8 *)((long)pvVar1 + 0x10),struct_list);
    *(undefined8 *)((long)pvVar1 + 0x40) = uVar5;
    pcVar6 = (char *)get_server_rep_FMformat(uVar5,&MetaDataRec);
    Formats->FormatServerRep = pcVar6;
    Formats->FormatServerRepLen = (long)(int)MetaDataRec.DataSize;
    pcVar6 = (char *)get_server_ID_FMformat(uVar5,&MetaDataRec);
    Formats->FormatIDRep = pcVar6;
    Formats->FormatIDRepLen = (long)(int)MetaDataRec.DataSize;
    Formats->Next = pFVar4;
  }
  lVar11 = *(long *)((long)pvVar1 + 0x50);
  if (lVar11 == 0) {
    local_108 = 0;
  }
  else {
    pFVar7 = (FFSFormatList)calloc(1,0x28);
    uVar5 = *(undefined8 *)((long)pvVar1 + 0x10);
    uVar3 = FMstruct_size_field_list(lVar11,8);
    local_108 = FMregister_simple_format(uVar5,"Attributes",lVar11,uVar3);
    pcVar6 = (char *)get_server_rep_FMformat(local_108,struct_list);
    pFVar7->FormatServerRep = pcVar6;
    pFVar7->FormatServerRepLen = (long)(int)struct_list[0].format_name;
    pcVar6 = (char *)get_server_ID_FMformat(local_108,struct_list);
    pFVar7->FormatIDRep = pcVar6;
    pFVar7->FormatIDRepLen = (long)(int)struct_list[0].format_name;
    pFVar7->Next = Formats;
    Formats = pFVar7;
  }
  puVar8 = (undefined8 *)malloc(0x10);
  uVar5 = create_FFSBuffer();
  uVar9 = create_FFSBuffer();
  AttributeSize = 0;
  if (*(long *)((long)pvVar1 + 0x40) == 0) {
    struct_list[0].format_name = (char *)0x0;
    struct_list[0].field_list = (FMFieldList)0x0;
  }
  else {
    struct_list[0].field_list =
         (FMFieldList)FFSencode(uVar9,*(long *)((long)pvVar1 + 0x40),Stream->D,&DataSize);
    struct_list[0].format_name = (char *)DataSize;
  }
  puVar8[1] = uVar9;
  pvVar10 = Stream->M;
  *(char **)((long)pvVar10 + 0x10) = struct_list[0].format_name;
  DataSize = (size_t)struct_list[0].format_name;
  MetaDataRec.block =
       (char *)FFSencode(uVar5,*(undefined8 *)((long)pvVar1 + 0x28),pvVar10,&MetaDataSize);
  MetaDataRec.DataSize = MetaDataSize;
  *puVar8 = uVar5;
  if (*(long *)((long)pvVar1 + 0x50) == 0) {
    local_d0.block = (char *)0x0;
    local_d0.DataSize = 0;
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (void *)create_FFSBuffer();
    local_d0.block =
         (char *)FFSencode(pvVar10,local_108,*(undefined8 *)((long)pvVar1 + 0x60),&AttributeSize);
    local_d0.DataSize = AttributeSize;
  }
  pvVar2 = Stream->M;
  uVar5 = *(undefined8 *)((long)pvVar2 + 8);
  *(undefined8 *)((long)pvVar2 + 8) = 0;
  if (*(long *)((long)pvVar1 + 0x28) != 0) {
    FMfree_var_rec_elements();
  }
  if (*(long *)((long)pvVar1 + 0x40) != 0) {
    FMfree_var_rec_elements();
  }
  if ((Stream->M != (void *)0x0) && (Stream->MetadataSize != 0)) {
    memset(Stream->M,0,Stream->MetadataSize);
  }
  if ((Stream->D != (void *)0x0) && (Stream->DataSize != 0)) {
    memset(Stream->D,0,Stream->DataSize);
  }
  *(undefined8 *)((long)pvVar2 + 8) = uVar5;
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstFFSWriterEndStep::timer);
  }
  SstInternalProvideTimestep
            (Stream,&MetaDataRec,(SstData)struct_list,Timestep,Formats,FreeTSInfo,puVar8,&local_d0,
             FreeAttrInfo,pvVar10);
  if (pvVar10 != (void *)0x0) {
    free_FFSBuffer(pvVar10);
  }
  while (Formats != (FFSFormatList)0x0) {
    pFVar4 = Formats->Next;
    free(Formats);
    Formats = pFVar4;
  }
  if (*(long *)((long)pvVar1 + 0x50) != 0) {
    free_FMfield_list();
  }
  *(undefined8 *)((long)pvVar1 + 0x50) = 0;
  *(undefined4 *)((long)pvVar1 + 0x48) = 0;
  if (*(void **)((long)pvVar1 + 0x60) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x60));
  }
  *(undefined8 *)((long)pvVar1 + 0x60) = 0;
  *(undefined4 *)((long)pvVar1 + 0x68) = 0;
  return;
}

Assistant:

extern void SstFFSWriterEndStep(SstStream Stream, size_t Timestep)
{
    struct FFSWriterMarshalBase *Info;
    struct FFSFormatBlock *Formats = NULL;
    FMFormat AttributeFormat = NULL;

    PERFSTUBS_TIMER_START(timer, "Marshaling overhead in SstFFSWriterEndStep");

    CP_verbose(Stream, PerStepVerbose, "Calling SstWriterEndStep\n");
    // if field lists have changed, register formats with FFS local context, add
    // to format chain
    if (!Stream->WriterMarshalData)
    {
        InitMarshalData(Stream);
    }
    Info = (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
    if (!Info->MetaFormat && Info->MetaFieldCount)
    {
        struct FFSFormatBlock *Block = malloc(sizeof(*Block));
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "MetaData";
        struct_list[0].field_list = Info->MetaFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info->MetaFields, sizeof(char *));

        FMFormat Format = register_data_format(Info->LocalFMContext, &struct_list[0]);
        Info->MetaFormat = Format;
        int size;
        Block->FormatServerRep = get_server_rep_FMformat(Format, &size);
        Block->FormatServerRepLen = size;
        Block->FormatIDRep = get_server_ID_FMformat(Format, &size);
        Block->FormatIDRepLen = size;
        Block->Next = NULL;
        Formats = Block;
    }
    if (!Info->DataFormat && Info->DataFieldCount)
    {
        struct FFSFormatBlock *Block = malloc(sizeof(*Block));
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "Data";
        struct_list[0].field_list = Info->DataFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info->DataFields, sizeof(char *));
        FMFormat Format = register_data_format(Info->LocalFMContext, &struct_list[0]);
        Info->DataFormat = Format;
        int size;
        Block->FormatServerRep = get_server_rep_FMformat(Format, &size);
        Block->FormatServerRepLen = size;
        Block->FormatIDRep = get_server_ID_FMformat(Format, &size);
        Block->FormatIDRepLen = size;
        Block->Next = NULL;
        if (Formats)
        {
            Block->Next = Formats;
            Formats = Block;
        }
        else
        {
            Formats = Block;
        }
    }
    if (Info->AttributeFields)
    {
        struct FFSFormatBlock *Block = calloc(1, sizeof(*Block));
        FMFormat Format = FMregister_simple_format(
            Info->LocalFMContext, "Attributes", Info->AttributeFields,
            FMstruct_size_field_list(Info->AttributeFields, sizeof(char *)));
        AttributeFormat = Format;
        int size;
        Block->FormatServerRep = get_server_rep_FMformat(Format, &size);
        Block->FormatServerRepLen = size;
        Block->FormatIDRep = get_server_ID_FMformat(Format, &size);
        Block->FormatIDRepLen = size;
        Block->Next = NULL;
        if (Formats)
        {
            Block->Next = Formats;
            Formats = Block;
        }
        else
        {
            Formats = Block;
        }
    }
    // Encode Metadata and Data to create contiguous data blocks
    FFSTimestepInfo TSInfo = malloc(sizeof(*TSInfo));
    FFSBuffer MetaEncodeBuffer = create_FFSBuffer();
    FFSBuffer DataEncodeBuffer = create_FFSBuffer();
    FFSBuffer AttributeEncodeBuffer = NULL;
    struct _SstData DataRec;
    struct _SstData MetaDataRec;
    struct _SstData AttributeRec;
    size_t MetaDataSize;
    size_t DataSize;
    size_t AttributeSize = 0;
    struct FFSMetadataInfoStruct *MBase;
    if (Info->DataFormat)
    {
        DataRec.block = FFSencode(DataEncodeBuffer, Info->DataFormat, Stream->D, &DataSize);
        DataRec.DataSize = DataSize;
    }
    else
    {
        DataRec.block = NULL;
        DataRec.DataSize = 0;
        DataSize = 0;
    }
    TSInfo->DataEncodeBuffer = DataEncodeBuffer;

    MBase = Stream->M;
    MBase->DataBlockSize = DataSize;
    MetaDataRec.block = FFSencode(MetaEncodeBuffer, Info->MetaFormat, Stream->M, &MetaDataSize);
    MetaDataRec.DataSize = MetaDataSize;
    TSInfo->MetaEncodeBuffer = MetaEncodeBuffer;

    if (Info->AttributeFields)
    {
        AttributeEncodeBuffer = create_FFSBuffer();
        AttributeRec.block =
            FFSencode(AttributeEncodeBuffer, AttributeFormat, Info->AttributeData, &AttributeSize);
        AttributeRec.DataSize = AttributeSize;
    }
    else
    {
        AttributeRec.block = NULL;
        AttributeRec.DataSize = 0;
    }

    /* free all those copied dimensions, etc */
    MBase = Stream->M;
    size_t *tmp = MBase->BitField;
    /*
     * BitField value is saved away from FMfree_var_rec_elements() so that it
     * isn't unnecessarily free'd.
     */
    MBase->BitField = NULL;
    if (Info->MetaFormat)
        FMfree_var_rec_elements(Info->MetaFormat, Stream->M);
    if (Info->DataFormat)
        FMfree_var_rec_elements(Info->DataFormat, Stream->D);
    if (Stream->M && Stream->MetadataSize)
        memset(Stream->M, 0, Stream->MetadataSize);
    if (Stream->D && Stream->DataSize)
        memset(Stream->D, 0, Stream->DataSize);
    MBase->BitField = tmp;

    // Call SstInternalProvideStep with Metadata block, Data block and (any new)
    // formatID and formatBody
    //    printf("MetaDatablock is (Length %d):\n", MetaDataSize);
    //    FMdump_encoded_data(Info->MetaFormat, MetaDataRec.block, 1024000);
    //    printf("\nDatablock is :\n");
    //    FMdump_encoded_data(Info->DataFormat, DataRec.block, 1024000);
    //    if (AttributeEncodeBuffer) {
    //        printf("\nAttributeBlock is :\n");
    //        FMdump_encoded_data(AttributeFormat, AttributeRec.block, 1024000);
    //    }

    PERFSTUBS_TIMER_STOP(timer);

    SstInternalProvideTimestep(Stream, &MetaDataRec, &DataRec, Timestep, Formats, FreeTSInfo,
                               TSInfo, &AttributeRec, FreeAttrInfo, AttributeEncodeBuffer);
    if (AttributeEncodeBuffer)
    {
        free_FFSBuffer(AttributeEncodeBuffer);
    }
    while (Formats)
    {
        struct FFSFormatBlock *Tmp = Formats->Next;
        free(Formats);
        Formats = Tmp;
    }
    if (Info->AttributeFields)
        free_FMfield_list(Info->AttributeFields);
    Info->AttributeFields = NULL;
    Info->AttributeFieldCount = 0;
    if (Info->AttributeData)
        free(Info->AttributeData);
    Info->AttributeData = NULL;
    Info->AttributeSize = 0;
}